

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

QHttpHeaders __thiscall
QNetworkHeadersPrivate::fromRawToHttp(QNetworkHeadersPrivate *this,RawHeadersList *raw)

{
  QAnyStringView name;
  QAnyStringView value;
  QAnyStringView name_00;
  int iVar1;
  pair<QByteArray,_QByteArray> *ppVar2;
  pair<QByteArray,_QByteArray> *this_00;
  long in_FS_OFFSET;
  QByteArrayView a;
  QAnyStringView value_00;
  iterator __begin3;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((raw->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QHttpHeaders::QHttpHeaders((QHttpHeaders *)this);
      return (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)
             (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)this;
    }
  }
  else {
    (this->rawHeaderCache).headersList.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QHttpHeaders::QHttpHeaders((QHttpHeaders *)this);
    QHttpHeaders::reserve((QHttpHeaders *)this,(raw->d).size);
    this_00 = (raw->d).ptr;
    ppVar2 = this_00 + (raw->d).size;
    for (; this_00 != ppVar2; this_00 = this_00 + 1) {
      a = QHttpHeaders::wellKnownHeaderName(SetCookie);
      iVar1 = QByteArray::compare(&this_00->first,a,CaseInsensitive);
      if (iVar1 == 0) {
        local_58.m_haystack.m_data = (this_00->second).d.ptr;
        local_58.m_haystack.m_size = (this_00->second).d.size;
        local_58.super_QStringTokenizerBaseBase.m_sb.
        super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
        super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
             (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
        local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
        local_58.m_needle.ucs = L'\n';
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator
                  ((iterator *)local_98,&local_58);
        while (local_98[0x18] != false) {
          name_00.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(this_00->first).d.ptr;
          name_00.m_size = (this_00->first).d.size;
          value_00.m_size = local_98._8_8_ | 0x4000000000000000;
          value_00.field_0.m_data = (void *)local_98._16_8_;
          QHttpHeaders::append((QHttpHeaders *)this,name_00,value_00);
          QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_98);
        }
      }
      else {
        name.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(this_00->first).d.ptr;
        name.m_size = (this_00->first).d.size;
        value.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(this_00->second).d.ptr;
        value.m_size = (this_00->second).d.size;
        QHttpHeaders::append((QHttpHeaders *)this,name,value);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)
             (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QHttpHeaders QNetworkHeadersPrivate::fromRawToHttp(const RawHeadersList &raw)
{
    if (raw.empty())
        return {};

    QHttpHeaders headers;
    headers.reserve(raw.size());

    for (const auto &[key, value] : raw) {
        const bool isSetCookie = key.compare(QHttpHeaders::wellKnownHeaderName(
                                             QHttpHeaders::WellKnownHeader::SetCookie),
                                             Qt::CaseInsensitive) == 0;
        if (isSetCookie) {
            for (auto header : QLatin1StringView(value).tokenize('\n'_L1))
                headers.append(key, header);
        } else {
            headers.append(key, value);
        }
    }

    return headers;
}